

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# implot_items.cpp
# Opt level: O0

void ImPlot::PlotBarsHEx<ImPlot::GetterXsYs<unsigned_short>,double>
               (char *label_id,GetterXsYs<unsigned_short> *getter,double height)

{
  bool bVar1;
  ImU32 col;
  ImU32 col_00;
  ImPlotNextItemData *col_01;
  ImDrawList *this;
  double dVar2;
  ImPlotPoint IVar3;
  ImVec2 local_a0;
  ImVec2 b;
  ImVec2 a;
  ImPlotPoint p_1;
  int i_1;
  bool rend_line;
  ImU32 col_fill;
  ImU32 col_line;
  ImDrawList *DrawList;
  ImPlotNextItemData *s;
  ImPlotPoint local_50;
  undefined1 local_40 [8];
  ImPlotPoint p;
  int i;
  double half_height;
  double height_local;
  GetterXsYs<unsigned_short> *getter_local;
  char *label_id_local;
  
  bVar1 = BeginItem(label_id,1);
  if (bVar1) {
    dVar2 = height / 2.0;
    bVar1 = FitThisFrame();
    if (bVar1) {
      for (p.y._4_4_ = 0; p.y._4_4_ < getter->Count; p.y._4_4_ = p.y._4_4_ + 1) {
        _local_40 = GetterXsYs<unsigned_short>::operator()(getter,p.y._4_4_);
        ImPlotPoint::ImPlotPoint(&local_50,0.0,p.x - dVar2);
        FitPoint(&local_50);
        ImPlotPoint::ImPlotPoint((ImPlotPoint *)&s,(double)local_40,p.x + dVar2);
        FitPoint((ImPlotPoint *)&s);
      }
    }
    col_01 = GetItemData();
    this = GetPlotDrawList();
    col = ImGui::GetColorU32(col_01->Colors);
    col_00 = ImGui::GetColorU32(col_01->Colors + 1);
    p_1.y._7_1_ = col_01->RenderLine & 1;
    if (((col_01->RenderFill & 1U) != 0) && (col == col_00)) {
      p_1.y._7_1_ = 0;
    }
    for (p_1.y._0_4_ = 0; p_1.y._0_4_ < getter->Count; p_1.y._0_4_ = p_1.y._0_4_ + 1) {
      IVar3 = GetterXsYs<unsigned_short>::operator()(getter,p_1.y._0_4_);
      a = (ImVec2)IVar3.x;
      if (((double)a != 0.0) || (NAN((double)a))) {
        p_1.x = IVar3.y;
        b = PlotToPixels(0.0,p_1.x - dVar2,-1);
        local_a0 = PlotToPixels((double)a,p_1.x + dVar2,-1);
        if ((col_01->RenderFill & 1U) != 0) {
          ImDrawList::AddRectFilled(this,&b,&local_a0,col_00,0.0,0xf);
        }
        if (p_1.y._7_1_ != 0) {
          ImDrawList::AddRect(this,&b,&local_a0,col,0.0,0xf,col_01->LineWeight);
        }
      }
    }
    EndItem();
  }
  return;
}

Assistant:

void PlotBarsHEx(const char* label_id, const Getter& getter, THeight height) {
    if (BeginItem(label_id, ImPlotCol_Fill)) {
        const THeight half_height = height / 2;
        if (FitThisFrame()) {
            for (int i = 0; i < getter.Count; ++i) {
                ImPlotPoint p = getter(i);
                FitPoint(ImPlotPoint(0, p.y - half_height));
                FitPoint(ImPlotPoint(p.x, p.y + half_height));
            }
        }
        const ImPlotNextItemData& s = GetItemData();
        ImDrawList& DrawList = *GetPlotDrawList();
        ImU32 col_line  = ImGui::GetColorU32(s.Colors[ImPlotCol_Line]);
        ImU32 col_fill  = ImGui::GetColorU32(s.Colors[ImPlotCol_Fill]);
        bool  rend_line = s.RenderLine;
        if (s.RenderFill && col_line == col_fill)
            rend_line = false;
        for (int i = 0; i < getter.Count; ++i) {
            ImPlotPoint p = getter(i);
            if (p.x == 0)
                continue;
            ImVec2 a = PlotToPixels(0, p.y - half_height);
            ImVec2 b = PlotToPixels(p.x, p.y + half_height);
            if (s.RenderFill)
                DrawList.AddRectFilled(a, b, col_fill);
            if (rend_line)
                DrawList.AddRect(a, b, col_line, 0, ImDrawCornerFlags_All, s.LineWeight);
        }
        EndItem();
    }
}